

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::prepareTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLint *pageSizeX;
  GLint *pageSizeY;
  GLenum err;
  GLint GVar1;
  int iVar2;
  TextureFormat TVar3;
  int iVar4;
  
  gl4cts::Texture::Generate(gl,texture);
  (*gl->bindTexture)(target,*texture);
  err = (*gl->getError)();
  glu::checkError(err,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  GVar1 = SparseTextureUtils::getTargetDepth(target);
  (this->mState).minDepth = GVar1;
  pageSizeX = &(this->mState).pageSizeX;
  pageSizeY = &(this->mState).pageSizeY;
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,pageSizeX,pageSizeY,&(this->mState).pageSizeZ);
  if ((target == 0x8513) || (target == 0x9009)) {
    iVar4 = *pageSizeX;
    iVar2 = *pageSizeY;
    if (iVar2 < iVar4) {
      *pageSizeY = iVar4;
      iVar2 = iVar4;
    }
    else if (iVar4 < iVar2) {
      *pageSizeX = iVar2;
      iVar4 = iVar2;
    }
  }
  else {
    iVar4 = *pageSizeX;
    iVar2 = *pageSizeY;
  }
  (this->mState).width = iVar4 * 2;
  (this->mState).height = iVar2 * 2;
  (this->mState).depth = (this->mState).pageSizeZ * (this->mState).minDepth * 2;
  TVar3 = glu::mapGLInternalFormat(format);
  (this->mState).format = TVar3;
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::prepareTexture(const Functions& gl, GLint target, GLint format, GLuint& texture)
{
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	mState.minDepth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ);

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (mState.pageSizeX > mState.pageSizeY)
			mState.pageSizeY = mState.pageSizeX;
		else if (mState.pageSizeX < mState.pageSizeY)
			mState.pageSizeX = mState.pageSizeY;
	}

	mState.width  = 2 * mState.pageSizeX;
	mState.height = 2 * mState.pageSizeY;
	mState.depth  = 2 * mState.pageSizeZ * mState.minDepth;

	mState.format = glu::mapGLInternalFormat(format);

	return true;
}